

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpServer.h
# Opt level: O0

void __thiscall TcpServer::printEvent(TcpServer *this,int fd,uint32_t events)

{
  bool bVar1;
  uint16_t uVar2;
  ostream *poVar3;
  mapped_type *pmVar4;
  char *pcVar5;
  _Self local_30;
  iterator local_28;
  _Rb_tree_const_iterator<std::pair<const_int,_TcpConnection>_> local_20;
  uint32_t local_18;
  int local_14;
  uint32_t events_local;
  int fd_local;
  TcpServer *this_local;
  
  local_18 = events;
  local_14 = fd;
  _events_local = this;
  poVar3 = std::operator<<((ostream *)&std::cout,"***********************************************");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<((ostream *)&std::cout,"fd: ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_14);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  local_28._M_node =
       (_Base_ptr)
       std::
       map<int,_TcpConnection,_std::less<int>,_std::allocator<std::pair<const_int,_TcpConnection>_>_>
       ::find(&this->connections,&local_14);
  std::_Rb_tree_const_iterator<std::pair<const_int,_TcpConnection>_>::_Rb_tree_const_iterator
            (&local_20,&local_28);
  local_30._M_node =
       (_Base_ptr)
       std::
       map<int,_TcpConnection,_std::less<int>,_std::allocator<std::pair<const_int,_TcpConnection>_>_>
       ::cend(&this->connections);
  bVar1 = std::operator!=(&local_20,&local_30);
  if (bVar1) {
    pmVar4 = std::
             map<int,_TcpConnection,_std::less<int>,_std::allocator<std::pair<const_int,_TcpConnection>_>_>
             ::operator[](&this->connections,&local_14);
    pcVar5 = inet_ntoa((in_addr)(pmVar4->address).sin_addr.s_addr);
    poVar3 = std::operator<<((ostream *)&std::cout,pcVar5);
    poVar3 = std::operator<<(poVar3," : ");
    pmVar4 = std::
             map<int,_TcpConnection,_std::less<int>,_std::allocator<std::pair<const_int,_TcpConnection>_>_>
             ::operator[](&this->connections,&local_14);
    uVar2 = ntohs((pmVar4->address).sin_port);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,uVar2);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  }
  if ((local_18 & 1) != 0) {
    poVar3 = std::operator<<((ostream *)&std::cout,"EPOLLIN");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  }
  if ((local_18 & 2) != 0) {
    poVar3 = std::operator<<((ostream *)&std::cout,"EPOLLPRI");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  }
  if ((local_18 & 4) != 0) {
    poVar3 = std::operator<<((ostream *)&std::cout,"EPOLLOUT");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  }
  if ((local_18 & 0x40) != 0) {
    poVar3 = std::operator<<((ostream *)&std::cout,"EPOLLRDNORM");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  }
  if ((local_18 & 0x80) != 0) {
    poVar3 = std::operator<<((ostream *)&std::cout,"EPOLLRDBAND");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  }
  if ((local_18 & 0x100) != 0) {
    poVar3 = std::operator<<((ostream *)&std::cout,"EPOLLWRNORM");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  }
  if ((local_18 & 0x200) != 0) {
    poVar3 = std::operator<<((ostream *)&std::cout,"EPOLLWRBAND");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  }
  if ((local_18 & 0x400) != 0) {
    poVar3 = std::operator<<((ostream *)&std::cout,"EPOLLMSG");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  }
  if ((local_18 & 8) != 0) {
    poVar3 = std::operator<<((ostream *)&std::cout,"EPOLLERR");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  }
  if ((local_18 & 0x10) != 0) {
    poVar3 = std::operator<<((ostream *)&std::cout,"EPOLLHUP");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  }
  if ((local_18 & 0x2000) != 0) {
    poVar3 = std::operator<<((ostream *)&std::cout,"EPOLLRDHUP");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  }
  if ((local_18 & 0x20000000) != 0) {
    poVar3 = std::operator<<((ostream *)&std::cout,"EPOLLWAKEUP");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  }
  if ((local_18 & 0x40000000) != 0) {
    poVar3 = std::operator<<((ostream *)&std::cout,"EPOLLONESHOT");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  }
  if ((local_18 & 0x80000000) != 0) {
    poVar3 = std::operator<<((ostream *)&std::cout,"EPOLLET");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  }
  poVar3 = std::operator<<((ostream *)&std::cout,"***********************************************");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void printEvent(int fd, uint32_t events) {
    std::cout << "***********************************************" << std::endl;
    std::cout << "fd: " << fd << std::endl;
    if (connections.find(fd) != connections.cend()) {
      // 有可能是服务端套接字和通知管道套接字，就不能输出地址了
      std::cout << inet_ntoa(connections[fd].address.sin_addr) << " : "
                << ntohs(connections[fd].address.sin_port) << std::endl;
    }
    if (events & EPOLLIN) std::cout << "EPOLLIN" << std::endl;
    if (events & EPOLLPRI) std::cout << "EPOLLPRI" << std::endl;
    if (events & EPOLLOUT) std::cout << "EPOLLOUT" << std::endl;
    if (events & EPOLLRDNORM) std::cout << "EPOLLRDNORM" << std::endl;
    if (events & EPOLLRDBAND) std::cout << "EPOLLRDBAND" << std::endl;
    if (events & EPOLLWRNORM) std::cout << "EPOLLWRNORM" << std::endl;
    if (events & EPOLLWRBAND) std::cout << "EPOLLWRBAND" << std::endl;
    if (events & EPOLLMSG) std::cout << "EPOLLMSG" << std::endl;
    if (events & EPOLLERR) std::cout << "EPOLLERR" << std::endl;
    if (events & EPOLLHUP) std::cout << "EPOLLHUP" << std::endl;
    if (events & EPOLLRDHUP) std::cout << "EPOLLRDHUP" << std::endl;
    if (events & EPOLLWAKEUP) std::cout << "EPOLLWAKEUP" << std::endl;
    if (events & EPOLLONESHOT) std::cout << "EPOLLONESHOT" << std::endl;
    if (events & EPOLLET) std::cout << "EPOLLET" << std::endl;
    std::cout << "***********************************************" << std::endl;
  }